

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::setTexCubeBinding(ReferenceContext *this,int unitNdx,TextureCube *texture)

{
  int *piVar1;
  TextureCube *object;
  
  object = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start[unitNdx].texCubeBinding;
  if (object != (TextureCube *)0x0) {
    rc::ObjectManager<sglr::rc::Texture>::releaseReference(&this->m_textures,&object->super_Texture)
    ;
    (this->m_textureUnits).
    super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
    ._M_impl.super__Vector_impl_data._M_start[unitNdx].texCubeBinding = (TextureCube *)0x0;
  }
  if (texture != (TextureCube *)0x0) {
    piVar1 = &(texture->super_Texture).super_NamedObject.m_refCount;
    *piVar1 = *piVar1 + 1;
    (this->m_textureUnits).
    super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
    ._M_impl.super__Vector_impl_data._M_start[unitNdx].texCubeBinding = texture;
  }
  return;
}

Assistant:

void ReferenceContext::setTexCubeBinding (int unitNdx, TextureCube* texture)
{
	if (m_textureUnits[unitNdx].texCubeBinding)
	{
		m_textures.releaseReference(m_textureUnits[unitNdx].texCubeBinding);
		m_textureUnits[unitNdx].texCubeBinding = DE_NULL;
	}

	if (texture)
	{
		m_textures.acquireReference(texture);
		m_textureUnits[unitNdx].texCubeBinding = texture;
	}
}